

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

void Buf_ManStop(Buf_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *__ptr;
  void **__ptr_00;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Que_t *__ptr_01;
  Vec_Flt_t *__ptr_02;
  float *__ptr_03;
  
  printf("Sep = %d. Dup = %d. Br0 = %d. Br1 = %d. BrC = %d.  ",(ulong)(uint)p->nSeparate,
         (ulong)(uint)p->nDuplicate,(ulong)(uint)p->nBranch0,(ulong)(uint)p->nBranch1,
         (ulong)(uint)p->nBranchCrit);
  iVar1 = p->pNtk->vObjs->nSize;
  printf("Orig = %d. Add = %d. Rem = %d.\n",(ulong)(uint)p->nObjStart,
         (ulong)(uint)(iVar1 - p->nObjStart),(ulong)(uint)(p->nObjAlloc - iVar1));
  __ptr = p->vFanouts;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  pVVar2 = p->vTfCone;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vNonCrit;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vDelays;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vOrder;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vOffsets;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vEdges;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vArr;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vDep;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  __ptr_01 = p->vQue;
  if (__ptr_01->pOrder != (int *)0x0) {
    free(__ptr_01->pOrder);
    __ptr_01->pOrder = (int *)0x0;
  }
  if (__ptr_01->pHeap != (int *)0x0) {
    free(__ptr_01->pHeap);
  }
  free(__ptr_01);
  __ptr_02 = p->vCounts;
  __ptr_03 = __ptr_02->pArray;
  if (__ptr_03 != (float *)0x0) {
    free(__ptr_03);
  }
  free(__ptr_02);
  free(p);
  return;
}

Assistant:

void Buf_ManStop( Buf_Man_t * p )
{
    printf( "Sep = %d. Dup = %d. Br0 = %d. Br1 = %d. BrC = %d.  ", 
        p->nSeparate, p->nDuplicate, p->nBranch0, p->nBranch1, p->nBranchCrit );
    printf( "Orig = %d. Add = %d. Rem = %d.\n", 
        p->nObjStart, Abc_NtkObjNumMax(p->pNtk) - p->nObjStart, 
        p->nObjAlloc - Abc_NtkObjNumMax(p->pNtk) );
    Vec_PtrFree( p->vFanouts );
    Vec_IntFree( p->vTfCone );
    Vec_IntFree( p->vNonCrit );
    Vec_IntFree( p->vDelays );
    Vec_IntFree( p->vOrder );
    Vec_IntFree( p->vOffsets );
    Vec_IntFree( p->vEdges );
    Vec_IntFree( p->vArr );
    Vec_IntFree( p->vDep );
//    Vec_QueCheck( p->vQue );
    Vec_QueFree( p->vQue );
    Vec_FltFree( p->vCounts );
    ABC_FREE( p );
}